

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O1

UnicodeSet * __thiscall
icu_63::Transliterator::getSourceSet(Transliterator *this,UnicodeSet *result)

{
  UnicodeSet *pUVar1;
  UnicodeSet *pUVar2;
  UnicodeSet *pUVar3;
  
  pUVar2 = result;
  (*(this->super_UObject)._vptr_UObject[0xf])();
  pUVar1 = (UnicodeSet *)this->filter;
  if (pUVar1 != (UnicodeSet *)0x0) {
    pUVar3 = (UnicodeSet *)0x0;
    if ((pUVar1->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject ==
        (_func_int **)&PTR__UnicodeSet_0048bcb8) {
      pUVar3 = pUVar1;
    }
    pUVar1 = pUVar3;
    if (pUVar3 == (UnicodeSet *)0x0) {
      pUVar1 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar2);
      if (pUVar1 == (UnicodeSet *)0x0) {
        pUVar1 = (UnicodeSet *)0x0;
      }
      else {
        UnicodeSet::UnicodeSet(pUVar1);
      }
      if (pUVar1 == (UnicodeSet *)0x0) {
        return result;
      }
      (*(this->filter->super_UnicodeMatcher)._vptr_UnicodeMatcher[5])
                (&this->filter->super_UnicodeMatcher,pUVar1);
    }
    pUVar2 = pUVar1;
    UnicodeSet::retainAll(result,pUVar1);
    if (pUVar3 == (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(pUVar1);
      UMemory::operator_delete((UMemory *)pUVar1,pUVar2);
    }
  }
  return result;
}

Assistant:

UnicodeSet& Transliterator::getSourceSet(UnicodeSet& result) const {
    handleGetSourceSet(result);
    if (filter != NULL) {
        UnicodeSet* filterSet = dynamic_cast<UnicodeSet*>(filter);
        UBool deleteFilterSet = FALSE;
        // Most, but not all filters will be UnicodeSets.  Optimize for
        // the high-runner case.
        if (filterSet == NULL) {
            filterSet = new UnicodeSet();
            // Check null pointer
            if (filterSet == NULL) {
                return result;
            }
            deleteFilterSet = TRUE;
            filter->addMatchSetTo(*filterSet);
        }
        result.retainAll(*filterSet);
        if (deleteFilterSet) {
            delete filterSet;
        }
    }
    return result;
}